

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void stable_grail_build_blocks(int **arr,int L,int K,int **extbuf,int LExtBuf)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  size_t __n;
  int **ppiVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int **ppiVar13;
  
  if (K < LExtBuf) {
    LExtBuf = K;
  }
  do {
    uVar4 = LExtBuf;
    LExtBuf = uVar4 - 1 & uVar4;
  } while (LExtBuf != 0);
  if (uVar4 == 0) {
    if (1 < L) {
      uVar6 = 1;
      ppiVar8 = arr;
      do {
        piVar1 = ppiVar8[-2];
        uVar2 = (ulong)(*ppiVar8[1] < **ppiVar8);
        ppiVar8[-2] = ppiVar8[uVar2];
        ppiVar8[uVar2] = piVar1;
        piVar1 = ppiVar8[-1];
        ppiVar8[-1] = ppiVar8[1 - uVar2];
        ppiVar8[1 - uVar2] = piVar1;
        uVar6 = uVar6 + 2;
        ppiVar8 = ppiVar8 + 2;
      } while (uVar6 < (uint)L);
    }
    if ((L & 1U) != 0) {
      piVar1 = arr[(long)L + -1];
      arr[(long)L + -1] = arr[(long)L + -3];
      arr[(long)L + -3] = piVar1;
    }
    ppiVar8 = arr + -2;
    iVar11 = 2;
  }
  else {
    __n = (long)(int)uVar4 * 8;
    memcpy(extbuf,arr + -(long)(int)uVar4,__n);
    if (1 < L) {
      uVar6 = 1;
      ppiVar8 = arr;
      do {
        iVar12 = **ppiVar8;
        iVar11 = *ppiVar8[1];
        ppiVar8[-2] = ppiVar8[iVar11 < iVar12];
        ppiVar8[-1] = ppiVar8[1 - (ulong)(iVar11 < iVar12)];
        uVar6 = uVar6 + 2;
        ppiVar8 = ppiVar8 + 2;
      } while (uVar6 < (uint)L);
    }
    lVar5 = (long)L;
    if ((L & 1U) != 0) {
      arr[lVar5 + -3] = arr[lVar5 + -1];
    }
    ppiVar8 = arr + -2;
    iVar11 = 2;
    if (2 < (int)uVar4) {
      iVar12 = 2;
      do {
        iVar11 = iVar12 * 2;
        uVar3 = L + iVar12 * -2;
        lVar10 = 0;
        if (-1 < (int)uVar3) {
          lVar10 = 0;
          ppiVar13 = ppiVar8;
          do {
            stable_grail_merge_left_with_x_buf(ppiVar13,iVar12,iVar12,-iVar12);
            lVar10 = lVar10 + iVar11;
            ppiVar13 = ppiVar13 + iVar11;
          } while (lVar10 <= (long)(ulong)uVar3);
        }
        iVar9 = (int)lVar10;
        iVar7 = (L - iVar9) - iVar12;
        if (iVar7 == 0 || L - iVar9 < iVar12) {
          if (iVar9 < L) {
            lVar10 = (long)iVar9;
            do {
              ppiVar8[lVar10 - iVar12] = ppiVar8[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar5 != lVar10);
          }
        }
        else {
          stable_grail_merge_left_with_x_buf(ppiVar8 + iVar9,iVar12,iVar7,-iVar12);
        }
        ppiVar8 = ppiVar8 + -(long)iVar12;
        iVar12 = iVar11;
      } while (iVar11 < (int)uVar4);
    }
    memcpy(ppiVar8 + lVar5,extbuf,__n);
  }
  while (iVar11 < K) {
    iVar12 = iVar11 * 2;
    uVar4 = L + iVar11 * -2;
    lVar5 = 0;
    if (-1 < (int)uVar4) {
      lVar5 = 0;
      ppiVar13 = ppiVar8;
      do {
        stable_grail_merge_left(ppiVar13,iVar11,iVar11,-iVar11);
        lVar5 = lVar5 + iVar12;
        ppiVar13 = ppiVar13 + iVar12;
      } while (lVar5 <= (long)(ulong)uVar4);
    }
    iVar7 = L - (int)lVar5;
    if (iVar7 - iVar11 == 0 || iVar7 < iVar11) {
      stable_grail_rotate(ppiVar8 + (int)lVar5 + -(long)iVar11,iVar11,iVar7);
    }
    else {
      stable_grail_merge_left(ppiVar8 + (int)lVar5,iVar11,iVar7 - iVar11,-iVar11);
    }
    ppiVar8 = ppiVar8 + -(long)iVar11;
    iVar11 = iVar12;
  }
  iVar11 = L % (K * 2);
  iVar12 = L - iVar11;
  if (iVar11 - K == 0 || iVar11 < K) {
    stable_grail_rotate(ppiVar8 + iVar12,iVar11,K);
  }
  else {
    stable_grail_merge_right(ppiVar8 + iVar12,K,iVar11 - K,K);
  }
  if (0 < iVar12) {
    do {
      iVar11 = K * -2 + iVar12;
      iVar12 = iVar12 + K * -2;
      stable_grail_merge_right(ppiVar8 + iVar11,K,K,K);
    } while (0 < iVar12);
  }
  return;
}

Assistant:

static void GRAIL_BUILD_BLOCKS(SORT_TYPE *arr, int L, int K, SORT_TYPE *extbuf,
                               int LExtBuf) {
  int m, u, h, p0, p1, rest, restk, p, kbuf;
  kbuf = K < LExtBuf ? K : LExtBuf;

  while (kbuf & (kbuf - 1)) {
    kbuf &= kbuf - 1; /* max power or 2 - just in case */
  }

  if (kbuf) {
    SORT_TYPE_CPY(extbuf, arr - kbuf, kbuf);

    for (m = 1; m < L; m += 2) {
      u = 0;

      if (SORT_CMP_A(arr + (m - 1), arr + m) > 0) {
        u = 1;
      }

      arr[m - 3] = arr[m - 1 + u];
      arr[m - 2] = arr[m - u];
    }

    if (L % 2) {
      arr[L - 3] = arr[L - 1];
    }

    arr -= 2;

    for (h = 2; h < kbuf; h *= 2) {
      p0 = 0;
      p1 = L - 2 * h;

      while (p0 <= p1) {
        GRAIL_MERGE_LEFT_WITH_X_BUF(arr + p0, h, h, -h);
        p0 += 2 * h;
      }

      rest = L - p0;

      if (rest > h) {
        GRAIL_MERGE_LEFT_WITH_X_BUF(arr + p0, h, rest - h, -h);
      } else {
        for (; p0 < L; p0++) {
          arr[p0 - h] = arr[p0];
        }
      }

      arr -= h;
    }

    SORT_TYPE_CPY(arr + L, extbuf, kbuf);
  } else {
    for (m = 1; m < L; m += 2) {
      u = 0;

      if (SORT_CMP_A(arr + (m - 1), arr + m) > 0) {
        u = 1;
      }

      GRAIL_SWAP1(arr + (m - 3), arr + (m - 1 + u));
      GRAIL_SWAP1(arr + (m - 2), arr + (m - u));
    }

    if (L % 2) {
      GRAIL_SWAP1(arr + (L - 1), arr + (L - 3));
    }

    arr -= 2;
    h = 2;
  }

  for (; h < K; h *= 2) {
    p0 = 0;
    p1 = L - 2 * h;

    while (p0 <= p1) {
      GRAIL_MERGE_LEFT(arr + p0, h, h, -h);
      p0 += 2 * h;
    }

    rest = L - p0;

    if (rest > h) {
      GRAIL_MERGE_LEFT(arr + p0, h, rest - h, -h);
    } else {
      GRAIL_ROTATE(arr + p0 - h, h, rest);
    }

    arr -= h;
  }

  restk = L % (2 * K);
  p = L - restk;

  if (restk <= K) {
    GRAIL_ROTATE(arr + p, restk, K);
  } else {
    GRAIL_MERGE_RIGHT(arr + p, K, restk - K, K);
  }

  while (p > 0) {
    p -= 2 * K;
    GRAIL_MERGE_RIGHT(arr + p, K, K, K);
  }
}